

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O1

uint ppc_hash64_hpte_page_shift_noslb(PowerPCCPU_conflict3 *cpu,uint64_t pte0,uint64_t pte1)

{
  PPCHash64Options *pPVar1;
  uint uVar2;
  uint unaff_EBP;
  long lVar3;
  char cVar4;
  
  uVar2 = 0xc;
  if ((pte0 & 4) != 0) {
    pPVar1 = cpu->hash64_opts;
    lVar3 = 8;
    do {
      if (*(int *)((long)(pPVar1->sps[0].enc + -2) + lVar3) == 0) {
        cVar4 = '\x02';
      }
      else {
        uVar2 = hpte_page_shift((PPCHash64SegmentPageSizes *)
                                ((long)(pPVar1->sps[0].enc + -2) + lVar3),pte0,pte1);
        cVar4 = uVar2 != 0;
        if ((bool)cVar4) {
          unaff_EBP = uVar2;
        }
      }
      uVar2 = 0;
      if (cVar4 != '\0') {
        if (cVar4 == '\x02') {
          return 0;
        }
        return unaff_EBP;
      }
      lVar3 = lVar3 + 0x48;
    } while (lVar3 != 0x248);
  }
  return uVar2;
}

Assistant:

unsigned ppc_hash64_hpte_page_shift_noslb(PowerPCCPU *cpu,
                                          uint64_t pte0, uint64_t pte1)
{
    int i;

    if (!(pte0 & HPTE64_V_LARGE)) {
        return 12;
    }

    /*
     * The encodings in env->sps need to be carefully chosen so that
     * this gives an unambiguous result.
     */
    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64SegmentPageSizes *sps = &cpu->hash64_opts->sps[i];
        unsigned shift;

        if (!sps->page_shift) {
            break;
        }

        shift = hpte_page_shift(sps, pte0, pte1);
        if (shift) {
            return shift;
        }
    }

    return 0;
}